

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool PerlinNoise<Blob<224>>
               (hashfunc<Blob<224>_> hash,int inputLen,bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_38;
  
  local_38.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PerlinNoiseTest<Blob<224>>(0xc,0xc,inputLen,1,hash.m_hash,&local_38);
  bVar1 = TestHashList<Blob<224>>(&local_38,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_38.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool PerlinNoise ( hashfunc<hashtype> hash, int inputLen,
                   bool testColl, bool testDist, bool drawDiagram )
{
  //----------

  std::vector<hashtype> hashes;

  PerlinNoiseTest(12, 12, inputLen, 1, hash,hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}